

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O1

RealType __thiscall OpenMD::SC::getAlpha(SC *this,AtomType *atomType1,AtomType *atomType2)

{
  pointer pcVar1;
  int iVar2;
  RealType RVar3;
  RealType RVar4;
  double __x;
  string DistanceMix;
  SuttonChenAdapter sca2;
  SuttonChenAdapter sca1;
  locale local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  SuttonChenAdapter local_28;
  SuttonChenAdapter local_20;
  
  local_28.at_ = atomType2;
  local_20.at_ = atomType1;
  RVar3 = SuttonChenAdapter::getAlpha(&local_20);
  RVar4 = SuttonChenAdapter::getAlpha(&local_28);
  pcVar1 = (this->forceField_->forceFieldOptions_).DistanceMixingRule.data_._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,
             pcVar1 + (this->forceField_->forceFieldOptions_).DistanceMixingRule.data_.
                      _M_string_length);
  std::locale::locale(local_50);
  toUpper<std::__cxx11::string>(&local_48,local_50);
  std::locale::~locale(local_50);
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar2 == 0) {
    __x = RVar3 * RVar4;
    if (__x < 0.0) {
      RVar3 = sqrt(__x);
    }
    else {
      RVar3 = SQRT(__x);
    }
  }
  else {
    RVar3 = (RVar3 + RVar4) * 0.5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return RVar3;
}

Assistant:

RealType SC::getAlpha(AtomType* atomType1, AtomType* atomType2) {
    SuttonChenAdapter sca1 = SuttonChenAdapter(atomType1);
    SuttonChenAdapter sca2 = SuttonChenAdapter(atomType2);
    RealType alpha1        = sca1.getAlpha();
    RealType alpha2        = sca2.getAlpha();

    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
    std::string DistanceMix  = fopts.getDistanceMixingRule();
    toUpper(DistanceMix);

    if (DistanceMix == "GEOMETRIC")
      return sqrt(alpha1 * alpha2);
    else
      return 0.5 * (alpha1 + alpha2);
  }